

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O2

void lowmc_compute_aux(lowmc_parameters_t *lowmc,lowmc_key_t *key,randomTape_t *tapes)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  word256 v;
  word256 v_00;
  word256 v_01;
  word256 v_02;
  word256 v_03;
  word256 v_04;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  uint32_t uVar8;
  size_t size;
  long lVar9;
  lowmc_round_t *plVar10;
  uint32_t uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  bitstream_t parity_tape;
  mzd_local_t x [1];
  bitstream_t last_party_tape_3;
  bitstream_t last_party_tape;
  mzd_local_t key0 [1];
  mzd_local_t y [1];
  bitstream_t parity_tape_3;
  mzd_local_t key0_3 [1];
  undefined1 in_stack_fffffffffffffce0 [24];
  lowmc_key_t *plVar35;
  anon_union_8_2_94730226_for_buffer local_2e0;
  long lStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  anon_union_8_2_94730226_for_buffer local_2c0;
  long lStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  anon_union_8_2_94730226_for_buffer local_290;
  long local_288;
  anon_union_8_2_94730226_for_buffer local_280;
  long lStack_278;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  anon_union_8_2_94730226_for_buffer local_200;
  ulong local_1f8;
  anon_union_8_2_94730226_for_buffer local_1f0;
  long local_1e8;
  anon_union_8_2_94730226_for_buffer local_1e0;
  ulong local_1d8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  word local_80;
  word wStack_78;
  word128 local_70;
  
  size = (ulong)lowmc->n << 0x10;
  uVar7 = (uint)lowmc->m | (uint)size;
  if ((~DAT_0019408c & 0x20400) == 0) {
    if (uVar7 == 0xff0055) {
      local_2c0.w = (uint8_t *)0x0;
      lStack_2b8 = 0;
      uStack_2b0 = 0;
      uStack_2a8 = 0;
      plVar35 = key;
      mzd_copy_s256_256((mzd_local_t *)local_260,key);
      mzd_mul_v_s256_256(key,(mzd_local_t *)local_260,Ki_0);
      plVar10 = rounds + 3;
      uVar11 = 0x2fd;
      for (lVar12 = 0x5fa; lVar12 != -0x1fe; lVar12 = lVar12 + -0x1fe) {
        mzd_addmul_v_s256_256((mzd_local_t *)&local_2c0,plVar35,plVar10->k_matrix);
        mzd_mul_v_s256_256((mzd_local_t *)local_240,(mzd_local_t *)&local_2c0,plVar10->li_matrix);
        if (lVar12 == 0) {
          mzd_copy_s256_256((mzd_local_t *)&local_2c0,(mzd_local_t *)local_260);
          lVar9 = 0xff;
          uVar8 = 0;
        }
        else {
          local_2e0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
          size = 0xff;
          lStack_2d8 = lVar12;
          mzd_from_bitstream((bitstream_t *)&local_2e0,(mzd_local_t *)&local_2c0,4,0xff);
          lVar9 = lVar12 + 0xff;
          uVar8 = uVar11;
        }
        tapes->pos = (uint32_t)lVar9;
        tapes->aux_pos = uVar8;
        auVar27._8_8_ = lStack_2b8;
        auVar27._0_8_ = local_2c0.w;
        auVar27._16_8_ = uStack_2b0;
        auVar27._24_8_ = uStack_2a8;
        local_2e0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
        local_280 = *(anon_union_8_2_94730226_for_buffer *)(tapes->tape + 0xf);
        auVar23 = vpand_avx2(auVar27,_DAT_0010b740);
        auVar25 = vpand_avx2(auVar27,_DAT_0010b760);
        auVar24 = vpand_avx2(auVar27,_DAT_0010b780);
        auVar26 = vpsllq_avx2(auVar23,2);
        auVar23 = vpsrlq_avx2(auVar23,0x3e);
        auVar23 = vpermq_avx2(auVar23,0x93);
        auVar1 = vpor_avx2(auVar23,auVar26);
        auVar23 = vpaddq_avx2(auVar25,auVar25);
        auVar25 = vpsrlq_avx2(auVar25,0x3f);
        auVar25 = vpermq_avx2(auVar25,0x93);
        auVar2 = vpor_avx2(auVar25,auVar23);
        auVar23._8_8_ = local_240._8_8_;
        auVar23._0_8_ = local_240._0_8_;
        auVar23._16_16_ = local_240._16_16_;
        local_220 = auVar1 ^ auVar2;
        auVar25 = vpand_avx2(auVar23,_DAT_0010b760);
        auVar26 = vpand_avx2(auVar23,_DAT_0010b740);
        local_100 = auVar23 ^ auVar27;
        auVar23 = vpaddq_avx2(auVar25,auVar25);
        auVar25 = vpsrlq_avx2(auVar25,0x3f);
        auVar27 = vpsllq_avx2(auVar26,2);
        auVar26 = vpsrlq_avx2(auVar26,0x3e);
        auVar25 = vpermq_avx2(auVar25,0x93);
        auVar26 = vpermq_avx2(auVar26,0x93);
        auVar23 = vpternlogq_avx512vl(auVar25,local_220,auVar23,0x36);
        auVar25 = vpternlogq_avx512vl(auVar26,auVar1,auVar27,0x36);
        auVar27 = vpsllq_avx2(auVar23,0x3e);
        auVar26 = vpsrlq_avx2(auVar23,2);
        auVar23 = vpermq_avx2(auVar27,0x39);
        local_c0 = vpor_avx2(auVar23,auVar26);
        local_e0 = vpsrlq_avx2(auVar25,1);
        auVar23 = vpsllq_avx2(auVar25,0x3f);
        local_120 = vpermq_avx2(auVar23,0x39);
        local_160 = vpand_avx2(auVar1,auVar2);
        auVar23 = vpand_avx2(auVar1,auVar24);
        auVar25 = vpand_avx2(auVar2,auVar24);
        local_140 = vpsrlq_avx2(auVar23,2);
        auVar24 = vpsllq_avx2(auVar23,0x3e);
        local_1a0 = vpsrlq_avx2(auVar25,1);
        auVar23 = vpsllq_avx2(auVar25,0x3f);
        local_180 = vpermq_avx2(auVar24,0x39);
        auVar23 = vpermq_avx2(auVar23,0x39);
        lStack_2d8 = lVar9;
        lStack_278 = lVar9;
        local_1c0 = auVar23;
        w256_from_bitstream((word256 *)&local_2e0,(bitstream_t *)0x4,0xff,size);
        local_a0 = auVar23;
        w256_from_bitstream((word256 *)&local_280,(bitstream_t *)0x4,0xff,size);
        auVar25 = vpternlogq_avx512vl(local_160,local_100,_DAT_0010b780,0x78);
        auVar25 = vpternlogq_avx512vl(auVar25,local_1c0,local_1a0,0x1e);
        auVar25 = vpternlogq_avx512vl(auVar25,local_180,local_140,0x1e);
        auVar25 = vpternlogq_avx512vl(auVar25,local_120,local_e0,0x1e);
        auVar25 = vpternlogq_avx512vl(auVar25,local_a0,local_c0,0x96);
        local_220 = vpternlogq_avx512vl(auVar23,auVar25,local_220,0x96);
        v_01[3] = (longlong)plVar35;
        v_01[0] = in_stack_fffffffffffffce0._0_8_;
        v_01[1] = in_stack_fffffffffffffce0._8_8_;
        v_01[2] = in_stack_fffffffffffffce0._16_8_;
        lStack_278 = lVar9;
        w256_to_bitstream((bitstream_t *)&local_280,v_01,4,0xff);
        local_1e0 = (anon_union_8_2_94730226_for_buffer)tapes->aux_bits;
        local_1d8 = (ulong)tapes->aux_pos;
        v_02[3] = (longlong)plVar35;
        v_02[0] = in_stack_fffffffffffffce0._0_8_;
        v_02[1] = in_stack_fffffffffffffce0._8_8_;
        v_02[2] = in_stack_fffffffffffffce0._16_8_;
        w256_to_bitstream((bitstream_t *)&local_1e0,v_02,4,0xff);
        tapes->aux_pos = tapes->aux_pos + 0xff;
        uVar11 = uVar11 - 0xff;
        plVar10 = plVar10 + -1;
      }
    }
    else if (uVar7 == 0xc00040) {
      local_2c0.w = (uint8_t *)0x0;
      lStack_2b8 = 0;
      uStack_2b0 = 0;
      uStack_2a8 = 0;
      plVar35 = key;
      mzd_copy_s256_256((mzd_local_t *)local_260,key);
      mzd_mul_v_s256_192(key,(mzd_local_t *)local_260,Ki_0);
      plVar10 = rounds + 3;
      uVar11 = 0x240;
      for (lVar12 = 0x480; lVar12 != -0x180; lVar12 = lVar12 + -0x180) {
        mzd_addmul_v_s256_192((mzd_local_t *)&local_2c0,plVar35,plVar10->k_matrix);
        mzd_mul_v_s256_192((mzd_local_t *)local_240,(mzd_local_t *)&local_2c0,plVar10->li_matrix);
        if (lVar12 == 0) {
          mzd_copy_s256_256((mzd_local_t *)&local_2c0,(mzd_local_t *)local_260);
          lVar9 = 0xc0;
          uVar8 = 0;
        }
        else {
          local_2e0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
          size = 0xc0;
          lStack_2d8 = lVar12;
          mzd_from_bitstream((bitstream_t *)&local_2e0,(mzd_local_t *)&local_2c0,3,0xc0);
          lVar9 = lVar12 + 0xc0;
          uVar8 = uVar11;
        }
        tapes->pos = (uint32_t)lVar9;
        tapes->aux_pos = uVar8;
        auVar3._8_8_ = lStack_2b8;
        auVar3._0_8_ = local_2c0.w;
        auVar3._16_8_ = uStack_2b0;
        auVar3._24_8_ = uStack_2a8;
        local_2e0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
        local_280 = *(anon_union_8_2_94730226_for_buffer *)(tapes->tape + 0xf);
        auVar23 = vpand_avx2(auVar3,_DAT_0010b7a0);
        auVar25 = vpand_avx2(auVar3,_DAT_0010b7c0);
        auVar24 = vpand_avx2(auVar3,_DAT_0010b7e0);
        auVar26 = vpsllq_avx2(auVar23,2);
        auVar23 = vpsrlq_avx2(auVar23,0x3e);
        auVar23 = vpermq_avx2(auVar23,0x93);
        auVar1 = vpor_avx2(auVar23,auVar26);
        auVar23 = vpaddq_avx2(auVar25,auVar25);
        auVar25 = vpsrlq_avx2(auVar25,0x3f);
        auVar25 = vpermq_avx2(auVar25,0x93);
        auVar2 = vpor_avx2(auVar25,auVar23);
        auVar5._8_8_ = local_240._8_8_;
        auVar5._0_8_ = local_240._0_8_;
        auVar5._16_16_ = local_240._16_16_;
        local_220 = auVar1 ^ auVar2;
        auVar25 = vpand_avx2(auVar5,_DAT_0010b7c0);
        auVar26 = vpand_avx2(auVar5,_DAT_0010b7a0);
        local_100 = auVar5 ^ auVar3;
        auVar23 = vpaddq_avx2(auVar25,auVar25);
        auVar25 = vpsrlq_avx2(auVar25,0x3f);
        auVar27 = vpsllq_avx2(auVar26,2);
        auVar26 = vpsrlq_avx2(auVar26,0x3e);
        auVar25 = vpermq_avx2(auVar25,0x93);
        auVar26 = vpermq_avx2(auVar26,0x93);
        auVar23 = vpternlogq_avx512vl(auVar25,local_220,auVar23,0x36);
        auVar25 = vpternlogq_avx512vl(auVar26,auVar1,auVar27,0x36);
        auVar27 = vpsllq_avx2(auVar23,0x3e);
        auVar26 = vpsrlq_avx2(auVar23,2);
        auVar23 = vpermq_avx2(auVar27,0x39);
        local_c0 = vpor_avx2(auVar23,auVar26);
        local_e0 = vpsrlq_avx2(auVar25,1);
        auVar23 = vpsllq_avx2(auVar25,0x3f);
        local_120 = vpermq_avx2(auVar23,0x39);
        local_160 = vpand_avx2(auVar1,auVar2);
        auVar23 = vpand_avx2(auVar1,auVar24);
        auVar25 = vpand_avx2(auVar2,auVar24);
        local_140 = vpsrlq_avx2(auVar23,2);
        auVar24 = vpsllq_avx2(auVar23,0x3e);
        local_1a0 = vpsrlq_avx2(auVar25,1);
        auVar23 = vpsllq_avx2(auVar25,0x3f);
        local_180 = vpermq_avx2(auVar24,0x39);
        auVar23 = vpermq_avx2(auVar23,0x39);
        lStack_2d8 = lVar9;
        lStack_278 = lVar9;
        local_1c0 = auVar23;
        w256_from_bitstream((word256 *)&local_2e0,(bitstream_t *)0x3,0xc0,size);
        local_a0 = auVar23;
        w256_from_bitstream((word256 *)&local_280,(bitstream_t *)0x3,0xc0,size);
        auVar25 = vpternlogq_avx512vl(local_160,local_100,_DAT_0010b7e0,0x78);
        auVar25 = vpternlogq_avx512vl(auVar25,local_1c0,local_1a0,0x1e);
        auVar25 = vpternlogq_avx512vl(auVar25,local_180,local_140,0x1e);
        auVar25 = vpternlogq_avx512vl(auVar25,local_120,local_e0,0x1e);
        auVar25 = vpternlogq_avx512vl(auVar25,local_a0,local_c0,0x96);
        local_220 = vpternlogq_avx512vl(auVar23,auVar25,local_220,0x96);
        v[3] = (longlong)plVar35;
        v[0] = in_stack_fffffffffffffce0._0_8_;
        v[1] = in_stack_fffffffffffffce0._8_8_;
        v[2] = in_stack_fffffffffffffce0._16_8_;
        lStack_278 = lVar9;
        w256_to_bitstream((bitstream_t *)&local_280,v,3,0xc0);
        local_1e0 = (anon_union_8_2_94730226_for_buffer)tapes->aux_bits;
        local_1d8 = (ulong)tapes->aux_pos;
        v_00[3] = (longlong)plVar35;
        v_00[0] = in_stack_fffffffffffffce0._0_8_;
        v_00[1] = in_stack_fffffffffffffce0._8_8_;
        v_00[2] = in_stack_fffffffffffffce0._16_8_;
        w256_to_bitstream((bitstream_t *)&local_1e0,v_00,3,0xc0);
        tapes->aux_pos = tapes->aux_pos + 0xc0;
        uVar11 = uVar11 - 0xc0;
        plVar10 = plVar10 + -1;
      }
    }
    else {
      local_2c0.w = (uint8_t *)0x0;
      lStack_2b8 = 0;
      uStack_2b0 = 0;
      uStack_2a8 = 0;
      plVar35 = key;
      mzd_copy_s256_256((mzd_local_t *)local_260,key);
      mzd_mul_v_s256_129(key,(mzd_local_t *)local_260,Ki_0);
      plVar10 = rounds + 3;
      uVar11 = 0x183;
      for (lVar12 = 0x306; lVar12 != -0x102; lVar12 = lVar12 + -0x102) {
        mzd_addmul_v_s256_129((mzd_local_t *)&local_2c0,plVar35,plVar10->k_matrix);
        mzd_mul_v_s256_129((mzd_local_t *)local_240,(mzd_local_t *)&local_2c0,plVar10->li_matrix);
        if (lVar12 == 0) {
          mzd_copy_s256_256((mzd_local_t *)&local_2c0,(mzd_local_t *)local_260);
          lVar9 = 0x81;
          uVar8 = 0;
        }
        else {
          local_2e0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
          size = 0x81;
          lStack_2d8 = lVar12;
          mzd_from_bitstream((bitstream_t *)&local_2e0,(mzd_local_t *)&local_2c0,3,0x81);
          lVar9 = lVar12 + 0x81;
          uVar8 = uVar11;
        }
        tapes->pos = (uint32_t)lVar9;
        tapes->aux_pos = uVar8;
        auVar4._8_8_ = lStack_2b8;
        auVar4._0_8_ = local_2c0.w;
        auVar4._16_8_ = uStack_2b0;
        auVar4._24_8_ = uStack_2a8;
        local_2e0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
        local_280 = *(anon_union_8_2_94730226_for_buffer *)(tapes->tape + 0xf);
        auVar23 = vpand_avx2(auVar4,_DAT_0010b800);
        auVar25 = vpand_avx2(auVar4,_DAT_0010b820);
        auVar24 = vpand_avx2(auVar4,_DAT_0010b840);
        auVar26 = vpsllq_avx2(auVar23,2);
        auVar23 = vpsrlq_avx2(auVar23,0x3e);
        auVar23 = vpermq_avx2(auVar23,0x93);
        auVar1 = vpor_avx2(auVar23,auVar26);
        auVar23 = vpaddq_avx2(auVar25,auVar25);
        auVar25 = vpsrlq_avx2(auVar25,0x3f);
        auVar25 = vpermq_avx2(auVar25,0x93);
        auVar2 = vpor_avx2(auVar25,auVar23);
        auVar6._8_8_ = local_240._8_8_;
        auVar6._0_8_ = local_240._0_8_;
        auVar6._16_16_ = local_240._16_16_;
        local_220 = auVar1 ^ auVar2;
        auVar25 = vpand_avx2(auVar6,_DAT_0010b820);
        auVar26 = vpand_avx2(auVar6,_DAT_0010b800);
        local_100 = auVar6 ^ auVar4;
        auVar23 = vpaddq_avx2(auVar25,auVar25);
        auVar25 = vpsrlq_avx2(auVar25,0x3f);
        auVar27 = vpsllq_avx2(auVar26,2);
        auVar26 = vpsrlq_avx2(auVar26,0x3e);
        auVar25 = vpermq_avx2(auVar25,0x93);
        auVar26 = vpermq_avx2(auVar26,0x93);
        auVar23 = vpternlogq_avx512vl(auVar25,local_220,auVar23,0x36);
        auVar25 = vpternlogq_avx512vl(auVar26,auVar1,auVar27,0x36);
        auVar27 = vpsllq_avx2(auVar23,0x3e);
        auVar26 = vpsrlq_avx2(auVar23,2);
        auVar23 = vpermq_avx2(auVar27,0x39);
        local_c0 = vpor_avx2(auVar23,auVar26);
        local_e0 = vpsrlq_avx2(auVar25,1);
        auVar23 = vpsllq_avx2(auVar25,0x3f);
        local_120 = vpermq_avx2(auVar23,0x39);
        local_160 = vpand_avx2(auVar1,auVar2);
        auVar23 = vpand_avx2(auVar1,auVar24);
        auVar25 = vpand_avx2(auVar2,auVar24);
        local_140 = vpsrlq_avx2(auVar23,2);
        auVar24 = vpsllq_avx2(auVar23,0x3e);
        local_1a0 = vpsrlq_avx2(auVar25,1);
        auVar23 = vpsllq_avx2(auVar25,0x3f);
        local_180 = vpermq_avx2(auVar24,0x39);
        auVar23 = vpermq_avx2(auVar23,0x39);
        lStack_2d8 = lVar9;
        lStack_278 = lVar9;
        local_1c0 = auVar23;
        w256_from_bitstream((word256 *)&local_2e0,(bitstream_t *)0x3,0x81,size);
        local_a0 = auVar23;
        w256_from_bitstream((word256 *)&local_280,(bitstream_t *)0x3,0x81,size);
        auVar25 = vpternlogq_avx512vl(local_160,local_100,_DAT_0010b840,0x78);
        auVar25 = vpternlogq_avx512vl(auVar25,local_1c0,local_1a0,0x1e);
        auVar25 = vpternlogq_avx512vl(auVar25,local_180,local_140,0x1e);
        auVar25 = vpternlogq_avx512vl(auVar25,local_120,local_e0,0x1e);
        auVar25 = vpternlogq_avx512vl(auVar25,local_a0,local_c0,0x96);
        local_220 = vpternlogq_avx512vl(auVar23,auVar25,local_220,0x96);
        v_03[3] = (longlong)plVar35;
        v_03[0] = in_stack_fffffffffffffce0._0_8_;
        v_03[1] = in_stack_fffffffffffffce0._8_8_;
        v_03[2] = in_stack_fffffffffffffce0._16_8_;
        lStack_278 = lVar9;
        w256_to_bitstream((bitstream_t *)&local_280,v_03,3,0x81);
        local_1e0 = (anon_union_8_2_94730226_for_buffer)tapes->aux_bits;
        local_1d8 = (ulong)tapes->aux_pos;
        v_04[3] = (longlong)plVar35;
        v_04[0] = in_stack_fffffffffffffce0._0_8_;
        v_04[1] = in_stack_fffffffffffffce0._8_8_;
        v_04[2] = in_stack_fffffffffffffce0._16_8_;
        w256_to_bitstream((bitstream_t *)&local_1e0,v_04,3,0x81);
        tapes->aux_pos = tapes->aux_pos + 0x81;
        uVar11 = uVar11 - 0x81;
        plVar10 = plVar10 + -1;
      }
    }
  }
  else if (uVar7 == 0xff0055) {
    local_2e0.w = (uint8_t *)0x0;
    lStack_2d8 = 0;
    uStack_2d0 = 0;
    uStack_2c8 = 0;
    plVar35 = key;
    mzd_copy_s128_256((mzd_local_t *)&local_1e0,key);
    mzd_mul_v_s128_256(key,(mzd_local_t *)&local_1e0,Ki_0);
    plVar10 = rounds + 3;
    uVar11 = 0x2fd;
    lVar12 = 0x5fa;
    while( true ) {
      if (lVar12 == -0x1fe) break;
      mzd_addmul_v_s128_256((mzd_local_t *)&local_2e0,plVar35,plVar10->k_matrix);
      local_220._0_8_ = plVar10;
      mzd_mul_v_s128_256((mzd_local_t *)&local_280,(mzd_local_t *)&local_2e0,plVar10->li_matrix);
      local_c0._0_8_ = lVar12;
      if (lVar12 == 0) {
        mzd_copy_s128_256((mzd_local_t *)&local_2e0,(mzd_local_t *)&local_1e0);
        lVar12 = 0xff;
        uVar8 = 0;
      }
      else {
        local_2c0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
        lStack_2b8 = lVar12;
        mzd_from_bitstream((bitstream_t *)&local_2c0,(mzd_local_t *)&local_2e0,4,0xff);
        lVar12 = lVar12 + 0xff;
        uVar8 = uVar11;
      }
      tapes->pos = (uint32_t)lVar12;
      tapes->aux_pos = uVar8;
      auVar15._8_8_ = uStack_2c8;
      auVar15._0_8_ = uStack_2d0;
      auVar13._8_8_ = lStack_2d8;
      auVar13._0_8_ = local_2e0.w;
      auVar29._8_8_ = lStack_278;
      auVar29._0_8_ = local_280.w;
      auVar17 = vandpd_avx(_DAT_0010b6b0,auVar15);
      auVar14 = vpslldq_avx(auVar15,8);
      auVar20 = vandpd_avx(_DAT_0010b6a0,auVar15);
      auVar33 = vandpd_avx512vl(auVar13,_DAT_0010b690);
      auVar16 = vandpd_avx512vl(auVar29,_DAT_0010b690);
      auVar21 = vandpd_avx(_DAT_0010b6a0,auVar13);
      auVar28 = vandpd_avx512vl(auVar15,_DAT_0010b690);
      auVar19 = vandpd_avx512vl(auVar13,_DAT_0010b6c0);
      auVar18 = vpshldq_avx512_vbmi2(auVar17,auVar14,1);
      auVar17 = vpslldq_avx(auVar20,8);
      auVar31 = vpsrldq_avx(auVar33,8);
      auVar34 = vpsrldq_avx512vl(auVar16,8);
      auVar30 = vpsllq_avx(auVar33,2);
      auVar14._0_8_ = auVar16._0_8_ ^ auVar33._0_8_;
      auVar14._8_8_ = auVar16._8_8_ ^ auVar33._8_8_;
      auVar17 = vpshldq_avx512_vbmi2(auVar20,auVar17,2);
      auVar20 = vpsrlq_avx(auVar31,0x3e);
      auVar31 = vpsrlq_avx512vl(auVar34._0_16_,0x3e);
      auVar33 = vpaddq_avx(auVar14,auVar14);
      auVar14 = vpor_avx(auVar20,auVar17);
      auVar16 = vpaddq_avx(auVar21,auVar21);
      auVar32 = vpxorq_avx512vl(auVar30,auVar16);
      local_100._0_16_ = vmovdqa64_avx512vl(auVar32);
      auVar17 = vandpd_avx(local_270,_DAT_0010b6a0);
      auVar20 = vandpd_avx(local_270,_DAT_0010b6b0);
      auVar22 = vandpd_avx512vl(auVar29,_DAT_0010b6a0);
      auVar29 = vpternlogq_avx512vl(auVar29,_DAT_0010b6c0,auVar13,0x48);
      auVar34 = vpslldq_avx512vl(auVar17,8);
      auVar13 = vpaddq_avx(auVar22,auVar22);
      auVar17 = vpshldq_avx512_vbmi2(auVar17,auVar34._0_16_,2);
      auVar34 = vpslldq_avx512vl(local_270,8);
      auVar13 = vpxorq_avx512vl(auVar13,auVar32);
      auVar15 = vpternlogq_avx512vl(local_270,_DAT_0010b690,auVar15,0x48);
      auVar20 = vpshldq_avx512_vbmi2(auVar20,auVar34._0_16_,1);
      auVar32 = vpxorq_avx512vl(auVar14,auVar18);
      auVar31 = vpternlogq_avx512vl(auVar17,auVar14,auVar31,0x36);
      local_e0._0_16_ = vmovdqa64_avx512vl(auVar32);
      auVar17 = vpslldq_avx(auVar31,8);
      auVar20 = vpxorq_avx512vl(auVar20,auVar32);
      auVar17 = vpsllq_avx(auVar17,0x3f);
      auVar32 = vpslldq_avx(auVar20,8);
      auVar22 = vpsrldq_avx(auVar20,8);
      local_180._0_16_ = vpor_avx(auVar17,auVar33);
      local_140._0_16_ = vpand_avx(auVar30,auVar16);
      local_240._16_16_ = vpand_avx(auVar14,auVar18);
      auVar17 = vpand_avx(auVar14,auVar28);
      auVar16 = vpshldq_avx512_vbmi2(auVar32,auVar13,0x3e);
      auVar13 = vpshldq_avx512_vbmi2(auVar22,auVar20,0x3e);
      local_240._0_8_ = local_140._0_8_;
      local_240._8_8_ = local_140._8_8_;
      auVar20 = vpand_avx(auVar18,auVar28);
      local_120._0_16_ = local_240._16_16_;
      auVar33 = vpand_avx(auVar30,auVar19);
      auVar28 = vpslldq_avx(auVar17,8);
      auVar14 = vpsrldq_avx(auVar31,8);
      auVar33 = vpshldq_avx512_vbmi2(auVar28,auVar33,0x3e);
      local_160._0_16_ = vpshldq_avx512_vbmi2(auVar14,auVar31,0x3f);
      auVar33 = vpternlogq_avx512vl(auVar33,auVar29,auVar16,0x96);
      auVar16 = vpsrldq_avx(auVar17,8);
      auVar17 = vpshldq_avx512_vbmi2(auVar16,auVar17,0x3e);
      auVar16 = vpternlogq_avx512vl(auVar17,auVar15,auVar13,0x96);
      auVar17 = vpsrlq_avx(auVar19,1);
      local_260._0_16_ = vpand_avx(auVar17,auVar21);
      auVar17 = vpsrldq_avx(auVar20,8);
      local_260._16_16_ = vpshldq_avx512_vbmi2(auVar17,auVar20,0x3f);
      local_1c0._0_8_ = local_260._0_8_;
      local_1c0._8_8_ = local_260._8_8_;
      local_1a0._0_16_ = local_260._16_16_;
      local_1f0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
      local_290 = *(anon_union_8_2_94730226_for_buffer *)(tapes->tape + 0xf);
      local_288 = lVar12;
      local_1e8 = lVar12;
      w128_from_bitstream((bitstream_t *)&local_1f0,(word128 *)local_240,4,0xff);
      auVar17._8_8_ = local_240._8_8_;
      auVar17._0_8_ = local_240._0_8_;
      auVar17 = vpternlogq_avx512vl(auVar33,local_180._0_16_,auVar17,0x96);
      auVar20 = vpternlogq_avx512vl(auVar16,local_160._0_16_,local_240._16_16_,0x96);
      w128_from_bitstream((bitstream_t *)&local_290,(word128 *)local_260,4,0xff);
      auVar17 = vpternlogq_avx512vl(auVar17,local_100._0_16_,local_260._0_16_,0x96);
      auVar17 = vpternlogq_avx512vl(auVar17,local_1c0._0_16_,local_140._0_16_,0x96);
      auVar20 = vpternlogq_avx512vl(auVar20,local_e0._0_16_,local_260._16_16_,0x96);
      local_2c0 = auVar17._0_8_;
      lStack_2b8 = auVar17._8_8_;
      auVar17 = vpternlogq_avx512vl(auVar20,local_1a0._0_16_,local_120._0_16_,0x96);
      uStack_2b0 = auVar17._0_8_;
      uStack_2a8 = auVar17._8_8_;
      local_288 = lVar12;
      w128_to_bitstream((bitstream_t *)&local_290,(word128 *)&local_2c0,4,0xff);
      local_200 = (anon_union_8_2_94730226_for_buffer)tapes->aux_bits;
      local_1f8 = (ulong)tapes->aux_pos;
      w128_to_bitstream((bitstream_t *)&local_200,(word128 *)&local_2c0,4,0xff);
      tapes->aux_pos = tapes->aux_pos + 0xff;
      uVar11 = uVar11 - 0xff;
      plVar10 = (lowmc_round_t *)(local_220._0_8_ + -0x20);
      lVar12 = local_c0._0_8_ + -0x1fe;
    }
  }
  else if (uVar7 == 0xc00040) {
    local_2e0.w = (uint8_t *)0x0;
    lStack_2d8 = 0;
    uStack_2d0 = 0;
    uStack_2c8 = 0;
    plVar35 = key;
    mzd_copy_s128_256((mzd_local_t *)&local_1e0,key);
    mzd_mul_v_s128_192(key,(mzd_local_t *)&local_1e0,Ki_0);
    plVar10 = rounds + 3;
    uVar11 = 0x240;
    lVar12 = 0x480;
    while( true ) {
      if (lVar12 == -0x180) break;
      mzd_addmul_v_s128_192((mzd_local_t *)&local_2e0,plVar35,plVar10->k_matrix);
      local_220._0_8_ = plVar10;
      mzd_mul_v_s128_192((mzd_local_t *)&local_280,(mzd_local_t *)&local_2e0,plVar10->li_matrix);
      local_c0._0_8_ = lVar12;
      if (lVar12 == 0) {
        mzd_copy_s128_256((mzd_local_t *)&local_2e0,(mzd_local_t *)&local_1e0);
        lVar12 = 0xc0;
        uVar8 = 0;
      }
      else {
        local_2c0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
        lStack_2b8 = lVar12;
        mzd_from_bitstream((bitstream_t *)&local_2c0,(mzd_local_t *)&local_2e0,3,0xc0);
        lVar12 = lVar12 + 0xc0;
        uVar8 = uVar11;
      }
      tapes->pos = (uint32_t)lVar12;
      tapes->aux_pos = uVar8;
      auVar19._8_8_ = lStack_2d8;
      auVar19._0_8_ = local_2e0.w;
      auVar18._8_8_ = uStack_2c8;
      auVar18._0_8_ = uStack_2d0;
      auVar31._8_8_ = lStack_278;
      auVar31._0_8_ = local_280.w;
      auVar33 = vpand_avx(ZEXT816(0x4924924924924924),auVar18);
      auVar29 = vpsrldq_avx(auVar19,8);
      auVar17 = vandpd_avx(_DAT_0010b6b0,auVar19);
      auVar13 = vandpd_avx512vl(auVar31,_DAT_0010b6b0);
      auVar16 = vpand_avx(ZEXT816(0x2492492492492492),auVar18);
      auVar20 = vandpd_avx(_DAT_0010b690,auVar19);
      auVar14 = vandpd_avx512vl(auVar31,_DAT_0010b690);
      auVar21 = vandpd_avx(_DAT_0010b6a0,auVar19);
      auVar15 = vpandq_avx512vl(auVar18,ZEXT816(0x9249249249249249));
      auVar29 = vpshldq_avx512_vbmi2(auVar33,auVar29,1);
      auVar32 = vpslldq_avx(auVar17,8);
      auVar28 = vpsrldq_avx(auVar17,8);
      auVar20 = vpaddq_avx(auVar20,auVar20);
      auVar33 = vpaddq_avx(auVar14,auVar14);
      auVar14 = vpshldq_avx512_vbmi2(auVar17,auVar32,2);
      auVar32 = vpsrldq_avx(auVar13,8);
      auVar16 = vpshldq_avx512_vbmi2(auVar16,auVar28,2);
      auVar17 = vpxorq_avx512vl(auVar14,auVar20);
      auVar28 = vpxorq_avx512vl(auVar33,auVar17);
      local_100._0_16_ = vmovdqa64_avx512vl(auVar17);
      auVar17 = vpand_avx(local_270,ZEXT816(0x2492492492492492));
      auVar33 = vpand_avx(local_270,ZEXT816(0x4924924924924924));
      auVar18 = vpternlogq_avx512vl(local_270,ZEXT816(0x9249249249249249),auVar18,0x48);
      auVar22 = vpsrldq_avx(auVar28,8);
      auVar32 = vpshldq_avx512_vbmi2(auVar17,auVar32,2);
      auVar34 = vpslldq_avx512vl(auVar31,8);
      auVar28 = vpshldq_avx512_vbmi2(auVar22,auVar28,0x3e);
      auVar13 = vpshldq_avx512_vbmi2(auVar13,auVar34._0_16_,2);
      auVar34 = vpsrldq_avx512vl(auVar31,8);
      auVar19 = vpternlogq_avx512vl(auVar31,_DAT_0010b6a0,auVar19,0x48);
      auVar17 = vpshldq_avx512_vbmi2(auVar33,auVar34._0_16_,1);
      local_e0._0_16_ = auVar16 ^ auVar29;
      auVar17 = auVar17 ^ auVar16 ^ auVar29;
      auVar33 = vpslldq_avx(auVar32 ^ auVar16,8);
      local_180._0_16_ = vpshldq_avx512_vbmi2(auVar33,auVar13 ^ auVar14,0x3f);
      auVar33 = vpslldq_avx(auVar17,8);
      auVar31 = vpsrlq_avx(auVar17,2);
      auVar13 = vpsllq_avx(auVar33,0x3e);
      local_160._0_16_ = vpsrlq_avx(auVar32 ^ auVar16,1);
      local_140._0_16_ = vpand_avx(auVar14,auVar20);
      auVar17 = vpand_avx(auVar14,auVar21);
      auVar20 = vpand_avx(auVar20,auVar21);
      local_240._0_8_ = local_140._0_8_;
      local_240._8_8_ = local_140._8_8_;
      local_240._16_16_ = vpand_avx(auVar16,auVar29);
      auVar21 = vpand_avx(auVar16,auVar15);
      auVar33 = vpand_avx(auVar29,auVar15);
      local_120._0_16_ = local_240._16_16_;
      auVar14 = vpsrldq_avx(auVar17,8);
      auVar16 = vpslldq_avx(auVar21,8);
      auVar17 = vpshldq_avx512_vbmi2(auVar14,auVar17,0x3e);
      auVar16 = vpsllq_avx(auVar16,0x3e);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar19,auVar16,0x36);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar13,auVar28,0x1e);
      auVar21 = vpsrlq_avx(auVar21,2);
      auVar21 = vpternlogq_avx512vl(auVar21,auVar18,auVar31,0x56);
      auVar16 = vpslldq_avx(auVar33,8);
      local_260._0_16_ = vpshldq_avx512_vbmi2(auVar16,auVar20,0x3f);
      local_260._16_16_ = vpsrlq_avx(auVar33,1);
      local_1a0._0_16_ = local_260._16_16_;
      local_1c0._0_8_ = local_260._0_8_;
      local_1c0._8_8_ = local_260._8_8_;
      local_1f0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
      local_290 = *(anon_union_8_2_94730226_for_buffer *)(tapes->tape + 0xf);
      local_288 = lVar12;
      local_1e8 = lVar12;
      w128_from_bitstream((bitstream_t *)&local_1f0,(word128 *)local_240,3,0xc0);
      auVar16._8_8_ = local_240._8_8_;
      auVar16._0_8_ = local_240._0_8_;
      auVar17 = vpternlogq_avx512vl(auVar17,local_180._0_16_,auVar16,0x96);
      auVar20 = vpternlogq_avx512vl(auVar21,local_160._0_16_,local_240._16_16_,0x96);
      w128_from_bitstream((bitstream_t *)&local_290,(word128 *)local_260,3,0xc0);
      auVar17 = vpternlogq_avx512vl(auVar17,local_100._0_16_,local_260._0_16_,0x96);
      auVar17 = vpternlogq_avx512vl(auVar17,local_1c0._0_16_,local_140._0_16_,0x96);
      auVar20 = vpternlogq_avx512vl(auVar20,local_e0._0_16_,local_260._16_16_,0x96);
      local_2c0 = auVar17._0_8_;
      lStack_2b8 = auVar17._8_8_;
      auVar17 = vpternlogq_avx512vl(auVar20,local_1a0._0_16_,local_120._0_16_,0x96);
      uStack_2b0 = auVar17._0_8_;
      uStack_2a8 = auVar17._8_8_;
      local_288 = lVar12;
      w128_to_bitstream((bitstream_t *)&local_290,(word128 *)&local_2c0,3,0xc0);
      local_200 = (anon_union_8_2_94730226_for_buffer)tapes->aux_bits;
      local_1f8 = (ulong)tapes->aux_pos;
      w128_to_bitstream((bitstream_t *)&local_200,(word128 *)&local_2c0,3,0xc0);
      tapes->aux_pos = tapes->aux_pos + 0xc0;
      uVar11 = uVar11 - 0xc0;
      plVar10 = (lowmc_round_t *)(local_220._0_8_ + -0x20);
      lVar12 = local_c0._0_8_ + -0x180;
    }
  }
  else {
    local_2e0.w = (uint8_t *)0x0;
    lStack_2d8 = 0;
    uStack_2d0 = 0;
    uStack_2c8 = 0;
    plVar35 = key;
    mzd_copy_s128_256((mzd_local_t *)&local_1e0,key);
    mzd_mul_v_s128_129(key,(mzd_local_t *)&local_1e0,Ki_0);
    plVar10 = rounds + 3;
    uVar11 = 0x183;
    lVar12 = 0x306;
    while( true ) {
      if (lVar12 == -0x102) break;
      mzd_addmul_v_s128_129((mzd_local_t *)&local_2e0,plVar35,plVar10->k_matrix);
      mzd_mul_v_s128_129((mzd_local_t *)&local_280,(mzd_local_t *)&local_2e0,plVar10->li_matrix);
      local_220._0_8_ = lVar12;
      if (lVar12 == 0) {
        mzd_copy_s128_256((mzd_local_t *)&local_2e0,(mzd_local_t *)&local_1e0);
        lVar12 = 0x81;
        uVar8 = 0;
      }
      else {
        local_2c0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
        lStack_2b8 = lVar12;
        mzd_from_bitstream((bitstream_t *)&local_2c0,(mzd_local_t *)&local_2e0,3,0x81);
        lVar12 = lVar12 + 0x81;
        uVar8 = uVar11;
      }
      tapes->pos = (uint32_t)lVar12;
      tapes->aux_pos = uVar8;
      auVar28._8_8_ = lStack_2d8;
      auVar28._0_8_ = local_2e0.w;
      auVar21._8_8_ = uStack_2c8;
      auVar21._0_8_ = uStack_2d0;
      auVar14 = vmovdqa64_avx512vl(local_270);
      auVar17 = vandpd_avx(_DAT_0010b700,auVar28);
      auVar33 = vpand_avx(ZEXT816(0x4924924924924924),auVar21);
      auVar19 = vpsrldq_avx(auVar28,8);
      auVar16 = vpand_avx(ZEXT816(0x2492492492492492),auVar21);
      auVar15 = vpandq_avx512vl(auVar14,ZEXT816(0x2492492492492492));
      auVar20 = vandpd_avx(_DAT_0010b710,auVar28);
      auVar29 = vpandq_avx512vl(auVar14,ZEXT816(0x4924924924924924));
      auVar13 = vpand_avx(ZEXT816(0x9249249249249249),auVar21);
      auVar14 = vpternlogq_avx512vl(auVar14,ZEXT816(0x9249249249249249),auVar21,0x48);
      auVar21 = vandpd_avx(_DAT_0010b720,auVar28);
      auVar34 = vpslldq_avx512vl(auVar17,8);
      auVar31 = vpsrldq_avx(auVar17,8);
      auVar19 = vpshldq_avx512_vbmi2(auVar33,auVar19,1);
      auVar20 = vpaddq_avx(auVar20,auVar20);
      auVar18 = vpshldq_avx512_vbmi2(auVar17,auVar34._0_16_,2);
      auVar33._8_8_ = lStack_278;
      auVar33._0_8_ = local_280.w;
      auVar16 = vpshldq_avx512_vbmi2(auVar16,auVar31,2);
      auVar31 = vandpd_avx512vl(auVar33,_DAT_0010b700);
      auVar17 = vandpd_avx512vl(auVar33,_DAT_0010b710);
      auVar28 = vpternlogq_avx512vl(auVar33,_DAT_0010b720,auVar28,0x48);
      auVar32 = vpsrldq_avx(auVar31,8);
      auVar17 = vpaddq_avx(auVar17,auVar17);
      local_100._0_16_ = vmovdqa64_avx512vl(auVar28);
      auVar15 = vpshldq_avx512_vbmi2(auVar15,auVar32,2);
      auVar34 = vpslldq_avx512vl(auVar33,8);
      auVar28 = vpshldq_avx512_vbmi2(auVar31,auVar34._0_16_,2);
      auVar34 = vpsrldq_avx512vl(auVar33,8);
      auVar31 = vpxorq_avx512vl(auVar18,auVar20);
      auVar33 = vpshldq_avx512_vbmi2(auVar29,auVar34._0_16_,1);
      auVar17 = vpxorq_avx512vl(auVar17,auVar31);
      local_e0._0_16_ = vmovdqa64_avx512vl(auVar31);
      auVar29 = vpsrldq_avx(auVar17,8);
      local_c0._0_16_ = auVar16 ^ auVar19;
      auVar33 = auVar33 ^ auVar16 ^ auVar19;
      auVar17 = vpshldq_avx512_vbmi2(auVar29,auVar17,0x3e);
      auVar29 = vpslldq_avx(auVar33,8);
      auVar29 = vpsllq_avx(auVar29,0x3e);
      local_140._0_16_ = vpor_avx(auVar29,auVar17);
      auVar17 = vpslldq_avx(auVar15 ^ auVar16,8);
      local_160._0_16_ = vpshldq_avx512_vbmi2(auVar17,auVar28 ^ auVar18,0x3f);
      auVar29 = vpsrlq_avx(auVar33,2);
      local_1c0._0_16_ = vpsrlq_avx(auVar15 ^ auVar16,1);
      local_180._0_16_ = vpand_avx(auVar18,auVar20);
      auVar17 = vpand_avx(auVar18,auVar21);
      local_240._0_8_ = local_180._0_8_;
      local_240._8_8_ = local_180._8_8_;
      local_240._16_16_ = vpand_avx(auVar16,auVar19);
      auVar33 = vpand_avx(auVar16,auVar13);
      local_120._0_16_ = local_240._16_16_;
      auVar20 = vpand_avx(auVar20,auVar21);
      auVar21 = vpand_avx(auVar19,auVar13);
      auVar13 = vpslldq_avx(auVar33,8);
      auVar33 = vpsrlq_avx(auVar33,2);
      auVar15 = vpsrldq_avx(auVar17,8);
      auVar33 = vpternlogq_avx512vl(auVar33,auVar14,auVar29,0x56);
      auVar16 = vpslldq_avx(auVar21,8);
      auVar17 = vpshldq_avx512_vbmi2(auVar15,auVar17,0x3e);
      auVar13 = vpsllq_avx(auVar13,0x3e);
      local_260._0_16_ = vpshldq_avx512_vbmi2(auVar16,auVar20,0x3f);
      local_260._16_16_ = vpsrlq_avx(auVar21,1);
      local_a0._0_16_ = vpor_avx(auVar17,auVar13);
      local_1a0._0_16_ = local_260._16_16_;
      local_1f0 = (anon_union_8_2_94730226_for_buffer)tapes->parity_tapes;
      local_290 = *(anon_union_8_2_94730226_for_buffer *)(tapes->tape + 0xf);
      local_288 = lVar12;
      local_1e8 = lVar12;
      local_70 = (word128)local_260._0_16_;
      w128_from_bitstream((bitstream_t *)&local_1f0,(word128 *)local_240,3,0x81);
      auVar17 = vpternlogq_avx512vl(auVar33,local_1c0._0_16_,local_240._16_16_,0x96);
      local_80 = local_240._0_8_;
      wStack_78 = local_240._8_8_;
      w128_from_bitstream((bitstream_t *)&local_290,(word128 *)local_260,3,0x81);
      auVar20 = vpternlogq_avx512vl(local_a0._0_16_,local_180._0_16_,local_100._0_16_,0x56);
      auVar21 = vpternlogq_avx512vl(auVar20,local_160._0_16_,local_140._0_16_,0x96);
      auVar20._8_8_ = wStack_78;
      auVar20._0_8_ = local_80;
      auVar20 = vpternlogq_avx512vl(auVar21,auVar20,local_260._0_16_,0x96);
      auVar20 = vpternlogq_avx512vl(auVar20,(undefined1  [16])local_70,local_e0._0_16_,0x96);
      auVar17 = vpternlogq_avx512vl(auVar17,local_c0._0_16_,local_260._16_16_,0x96);
      local_2c0 = auVar20._0_8_;
      lStack_2b8 = auVar20._8_8_;
      auVar17 = vpternlogq_avx512vl(auVar17,local_1a0._0_16_,local_120._0_16_,0x96);
      uStack_2b0 = auVar17._0_8_;
      uStack_2a8 = auVar17._8_8_;
      local_288 = lVar12;
      w128_to_bitstream((bitstream_t *)&local_290,(word128 *)&local_2c0,3,0x81);
      local_200 = (anon_union_8_2_94730226_for_buffer)tapes->aux_bits;
      local_1f8 = (ulong)tapes->aux_pos;
      w128_to_bitstream((bitstream_t *)&local_200,(word128 *)&local_2c0,3,0x81);
      tapes->aux_pos = tapes->aux_pos + 0x81;
      uVar11 = uVar11 - 0x81;
      plVar10 = plVar10 + -1;
      lVar12 = local_220._0_8_ + -0x102;
    }
  }
  return;
}

Assistant:

void lowmc_compute_aux(const lowmc_parameters_t* lowmc, lowmc_key_t* key, randomTape_t* tapes) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  /* AVX2 enabled instances */
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_aux_s256_lowmc_129_129_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_aux_s256_lowmc_192_192_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_aux_s256_lowmc_255_255_4(key, tapes);
      return;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  /* SSE2/NEON enabled instances */
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_aux_s128_lowmc_129_129_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_aux_s128_lowmc_192_192_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_aux_s128_lowmc_255_255_4(key, tapes);
      return;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  /* uint64_t implementations */
  switch (lowmc_id) {
    /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    lowmc_aux_uint64_lowmc_129_129_4(key, tapes);
    return;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    lowmc_aux_uint64_lowmc_192_192_4(key, tapes);
    return;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    lowmc_aux_uint64_lowmc_255_255_4(key, tapes);
    return;
#endif
  }
#endif

  UNREACHABLE;
}